

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

void ImfFloatToHalfArray(int n,float *f,ImfHalf *h)

{
  uint16_t uVar1;
  undefined2 in_DX;
  undefined6 in_register_00000012;
  int in_EDI;
  int i;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
    Imath_3_2::half::half
              ((half *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    uVar1 = Imath_3_2::half::bits((half *)&stack0xffffffffffffffe2);
    *(uint16_t *)(CONCAT62(in_register_00000012,in_DX) + (long)iVar2 * 2) = uVar1;
  }
  return;
}

Assistant:

void
ImfFloatToHalfArray (int n, const float f[/*n*/], ImfHalf h[/*n*/])
{
    for (int i = 0; i < n; ++i)
        h[i] = half (f[i]).bits ();
}